

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::RegisterImports
          (NimBfbsGenerator *this,Object *object,Field *field,bool use_element)

{
  bool bVar1;
  Type *pTVar2;
  Object *pOVar3;
  char *pcVar4;
  String *pSVar5;
  ulong uVar6;
  int __c;
  int __c_00;
  BaseType local_258;
  char local_23a [2];
  char *local_238;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  string local_228;
  undefined1 local_208 [8];
  string import_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  string local_180;
  undefined1 local_160 [8];
  string ns_1;
  Enum *enum_def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string ns;
  Object *object_def;
  undefined1 local_68 [4];
  BaseType type;
  string type_name;
  string importns;
  bool use_element_local;
  Field *field_local;
  Object *object_local;
  NimBfbsGenerator *this_local;
  
  pOVar3 = object;
  std::__cxx11::string::string((string *)(type_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  if (use_element) {
    pTVar2 = reflection::Field::type(field);
    local_258 = reflection::Type::element(pTVar2);
  }
  else {
    pTVar2 = reflection::Field::type(field);
    local_258 = reflection::Type::base_type(pTVar2);
  }
  bVar1 = IsStructOrTable(local_258);
  if (bVar1) {
    pTVar2 = reflection::Field::type(field);
    pcVar4 = reflection::Type::index(pTVar2,(char *)pOVar3,__c);
    pOVar3 = BaseBfbsGenerator::GetObjectByIndex(&this->super_BaseBfbsGenerator,(int32_t)pcVar4);
    if (pOVar3 == this->current_obj_) {
      ns.field_2._12_4_ = 1;
      goto LAB_003d08f1;
    }
    std::__cxx11::string::string((string *)local_b0);
    pSVar5 = reflection::Object::name(pOVar3);
    String::str_abi_cxx11_(&local_f0,pSVar5);
    Denamespace(&local_d0,this,&local_f0,(string *)((long)&type_name.field_2 + 8),(string *)local_b0
               );
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    uVar6 = std::__cxx11::string::empty();
    bVar1 = (uVar6 & 1) != 0;
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_110,(string *)local_68);
    }
    else {
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     ".");
      std::operator+(&local_110,&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    }
    enum_def._7_1_ = !bVar1;
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    if (enum_def._7_1_) {
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  else {
    pTVar2 = reflection::Field::type(field);
    pcVar4 = reflection::Type::index(pTVar2,(char *)pOVar3,__c_00);
    ns_1.field_2._8_8_ =
         BaseBfbsGenerator::GetEnumByIndex(&this->super_BaseBfbsGenerator,(int32_t)pcVar4);
    if ((Enum *)ns_1.field_2._8_8_ == this->current_enum_) {
      ns.field_2._12_4_ = 1;
      goto LAB_003d08f1;
    }
    std::__cxx11::string::string((string *)local_160);
    pSVar5 = reflection::Enum::name((Enum *)ns_1.field_2._8_8_);
    String::str_abi_cxx11_(&local_1a0,pSVar5);
    Denamespace(&local_180,this,&local_1a0,(string *)((long)&type_name.field_2 + 8),
                (string *)local_160);
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    uVar6 = std::__cxx11::string::empty();
    import_path.field_2._M_local_buf[0xf] = '\0';
    if ((uVar6 & 1) == 0) {
      std::operator+(&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     ".");
      import_path.field_2._M_local_buf[0xf] = '\x01';
      std::operator+(&local_1c0,&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    }
    else {
      std::__cxx11::string::string((string *)&local_1c0,(string *)local_68);
    }
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    if ((import_path.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    std::__cxx11::string::~string((string *)local_160);
  }
  pSVar5 = reflection::Object::name(object);
  String::str_abi_cxx11_(&local_228,pSVar5);
  GetRelativePathFromNamespace((string *)local_208,this,&local_228,(string *)local_68);
  std::__cxx11::string::~string((string *)&local_228);
  local_230._M_current = (char *)std::__cxx11::string::begin();
  local_238 = (char *)std::__cxx11::string::end();
  local_23a[1] = 0x2e;
  local_23a[0] = '_';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_230,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_238,local_23a + 1,local_23a);
  RegisterImports(this,(string *)local_208,(string *)((long)&type_name.field_2 + 8));
  std::__cxx11::string::~string((string *)local_208);
  ns.field_2._12_4_ = 0;
LAB_003d08f1:
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void RegisterImports(const r::Object *object, const r::Field *field,
                       bool use_element = false) {
    std::string importns;
    std::string type_name;

    const r::BaseType type =
        use_element ? field->type()->element() : field->type()->base_type();

    if (IsStructOrTable(type)) {
      const r::Object *object_def = GetObjectByIndex(field->type()->index());
      if (object_def == current_obj_) { return; }
      std::string ns;
      type_name = Denamespace(object_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    } else {
      const r::Enum *enum_def = GetEnumByIndex(field->type()->index());
      if (enum_def == current_enum_) { return; }
      std::string ns;
      type_name = Denamespace(enum_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    }

    std::string import_path =
        GetRelativePathFromNamespace(object->name()->str(), type_name);
    std::replace(type_name.begin(), type_name.end(), '.', '_');
    RegisterImports(import_path, importns);
  }